

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O3

void __thiscall agg::gsv_text::text(gsv_text *this,char *text)

{
  pod_array<char> *this_00;
  size_t sVar1;
  char *pcVar2;
  uint size;
  
  if (text == (char *)0x0) {
    pcVar2 = this->m_chr;
    this->m_chr[0] = '\0';
  }
  else {
    sVar1 = strlen(text);
    size = (int)sVar1 + 1;
    this_00 = &this->m_text_buf;
    if ((this->m_text_buf).m_size < size) {
      pod_array<char>::resize(this_00,size);
    }
    memcpy(this_00->m_array,text,(ulong)size);
    pcVar2 = this_00->m_array;
  }
  this->m_text = pcVar2;
  return;
}

Assistant:

void gsv_text::text(const char* text)
    {
        if(text == 0)
        {
            m_chr[0] = 0;
            m_text = m_chr;
            return;
        }
        unsigned new_size = strlen(text) + 1;
        if(new_size > m_text_buf.size())
        {
            m_text_buf.resize(new_size);
        }
        memcpy(&m_text_buf[0], text, new_size);
        m_text = &m_text_buf[0];
    }